

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall mjs::print_visitor::operator()(print_visitor *this,regexp_literal_expression *e)

{
  wostream *pwVar1;
  
  pwVar1 = std::operator<<(this->os_,'/');
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar1,(e->re_).pattern_._M_dataplus._M_p,(e->re_).pattern_._M_string_length);
  pwVar1 = std::operator<<(pwVar1,'/');
  mjs::operator<<(pwVar1,(e->re_).flags_);
  return;
}

Assistant:

void operator()(const regexp_literal_expression& e) {
        os_ << '/' << e.re().pattern() << '/' << e.re().flags();
    }